

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O3

Mat * ssd(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _InputArray *p_Var8;
  size_type __n;
  undefined7 in_register_00000009;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  char in_R8B;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  Mat *this;
  Mat local_2a0 [8];
  Mat depth;
  long local_290;
  long *local_258;
  Mat local_240 [8];
  Mat left;
  long local_230;
  long *local_1f8;
  Mat local_1e0 [8];
  Mat right;
  long local_1d0;
  long *local_198;
  _OutputArray local_180;
  _InputArray local_168;
  undefined1 local_150 [8];
  vector<int,_std::allocator<int>_> tmp;
  long *local_108;
  _InputArray local_f0;
  ulong local_d8;
  ulong local_d0;
  Mat *local_c8;
  long local_c0;
  undefined1 auStack_b8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  min_ssd;
  long local_38;
  
  pcVar9 = (char *)CONCAT71(in_register_00000009,add_constant);
  uVar1 = **(uint **)(in2 + 0x40);
  uVar21 = (ulong)uVar1;
  uVar2 = (*(uint **)(in2 + 0x40))[1];
  uVar11 = (ulong)uVar2;
  cv::Mat::Mat(local_2a0,uVar1,uVar2,0);
  auStack_b8 = (undefined1  [8])0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_ssd.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bgr_to_grey(local_240);
  bgr_to_grey(local_1e0);
  if (in_R8B != '\0') {
    local_168.obj = local_150;
    local_150 = (undefined1  [8])0x4024000000000000;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_f0.sz.width = 0;
    local_f0.sz.height = 0;
    local_f0.flags = 0x1010000;
    local_168.flags = -0x3efdfffa;
    local_168.sz.width = 1;
    local_168.sz.height = 4;
    local_180.super__InputArray.sz.width = 0;
    local_180.super__InputArray.sz.height = 0;
    local_180.super__InputArray.flags = -0x3dff0000;
    local_180.super__InputArray.obj = local_1e0;
    local_f0.obj = local_1e0;
    p_Var8 = (_InputArray *)cv::noArray();
    cv::add(&local_f0,&local_168,&local_180,p_Var8,-1);
  }
  __n = (size_type)(int)uVar2;
  if (0 < (int)uVar1) {
    uVar16 = uVar21;
    do {
      local_f0.flags = 0x7fffffff;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_150,__n,&local_f0.flags,
                 (allocator_type *)&local_168);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)auStack_b8,(vector<int,_std::allocator<int>_> *)local_150);
      if (local_150 != (undefined1  [8])0x0) {
        operator_delete((void *)local_150);
      }
      uVar19 = (int)uVar16 - 1;
      uVar16 = (ulong)uVar19;
    } while (uVar19 != 0);
  }
  local_c0 = -uVar11;
  local_38 = 0;
  uVar16 = uVar11;
  local_c8 = in1;
  do {
    this = local_c8;
    cv::Mat::Mat((Mat *)local_150,uVar1,uVar2,0);
    iVar5 = std::__cxx11::string::compare(pcVar9);
    if (iVar5 == 0) {
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          if (local_38 != 0) {
            lVar13 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13 + *local_108 * uVar10) =
                   *(undefined1 *)(lVar13 + *local_198 * uVar10 + local_1d0);
              lVar13 = lVar13 + 1;
            } while (local_38 != lVar13);
          }
          if (local_38 < (long)__n) {
            lVar13 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13 + local_38 + *local_108 * uVar10) =
                   *(undefined1 *)(lVar13 + *local_198 * uVar10 + local_1d0);
              lVar13 = lVar13 + 1;
            } while (local_c0 + local_38 + lVar13 != 0);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar21);
LAB_00103c5c:
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            uVar12 = 3;
            if (3 < (int)uVar10) {
              uVar12 = uVar10 & 0xffffffff;
            }
            if (0 < (int)uVar2) {
              iVar6 = (int)uVar12 + -3;
              iVar5 = (int)uVar10 + 3;
              if ((int)(uVar1 - 1) <= iVar5) {
                iVar5 = uVar1 - 1;
              }
              uVar14 = 0;
              local_d0 = uVar10;
              do {
                uVar10 = 3;
                if (3 < (int)uVar14) {
                  uVar10 = uVar14 & 0xffffffff;
                }
                iVar17 = (int)uVar10 + -3;
                iVar20 = (int)uVar14 + 3;
                if ((int)(uVar2 - 1) <= iVar20) {
                  iVar20 = uVar2 - 1;
                }
                local_d8 = uVar14;
                iVar7 = std::__cxx11::string::compare(pcVar9);
                if (iVar7 == 0) {
                  if (iVar5 < iVar6) goto LAB_00103d81;
                  iVar7 = 0;
                  lVar13 = uVar12 - 3;
                  do {
                    if (iVar17 <= iVar20) {
                      lVar18 = uVar10 - 4;
                      do {
                        iVar15 = (uint)*(byte *)(*local_1f8 * lVar13 + local_230 + 1 + lVar18) -
                                 (uint)*(byte *)((long)tmp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                lVar18 + *local_108 * lVar13 + 1);
                        iVar7 = iVar7 + iVar15 * iVar15;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 < iVar20);
                    }
                    bVar4 = lVar13 < iVar5;
                    lVar13 = lVar13 + 1;
                  } while (bVar4);
                }
                else if (iVar5 < iVar6) {
LAB_00103d81:
                  iVar7 = 0;
                }
                else {
                  iVar7 = 0;
                  lVar13 = uVar12 - 3;
                  do {
                    if (iVar17 <= iVar20) {
                      lVar18 = uVar10 - 4;
                      do {
                        iVar15 = (uint)*(byte *)(*local_198 * lVar13 + local_1d0 + 1 + lVar18) -
                                 (uint)*(byte *)((long)tmp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                lVar18 + *local_108 * lVar13 + 1);
                        iVar7 = iVar7 + iVar15 * iVar15;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 < iVar20);
                    }
                    bVar4 = lVar13 < iVar5;
                    lVar13 = lVar13 + 1;
                  } while (bVar4);
                }
                piVar3 = (((pointer)((long)auStack_b8 + local_d0 * 0x18))->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (iVar7 < piVar3[local_d8]) {
                  piVar3[local_d8] = iVar7;
                  *(char *)(local_d8 + *local_258 * local_d0 + local_290) = (char)local_38 * '\x03';
                }
                uVar14 = local_d8 + 1;
                uVar10 = local_d0;
              } while (uVar14 != uVar11);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar21);
        }
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare(pcVar9);
      if (iVar5 != 0) {
        cv::Mat::Mat(this,0,0,0);
        cv::Mat::~Mat((Mat *)local_150);
        goto LAB_00103ebb;
      }
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          if (local_38 < (long)__n) {
            uVar12 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + uVar12 + *local_108 * uVar10) =
                   *(undefined1 *)(uVar12 + *local_1f8 * uVar10 + local_230 + local_38);
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
          }
          lVar13 = (long)(int)uVar16;
          if (local_38 != 0) {
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13 + *local_108 * uVar10) =
                   *(undefined1 *)(lVar13 + *local_1f8 * uVar10 + local_230);
              lVar13 = lVar13 + 1;
            } while (lVar13 < (long)__n);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar21);
        goto LAB_00103c5c;
      }
    }
    cv::Mat::~Mat((Mat *)local_150);
    this = local_c8;
    local_38 = local_38 + 1;
    uVar16 = (ulong)((int)uVar16 - 1);
  } while (local_38 != 0x50);
  cv::Mat::Mat(local_c8,local_2a0);
LAB_00103ebb:
  cv::Mat::~Mat(local_1e0);
  cv::Mat::~Mat(local_240);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)auStack_b8);
  cv::Mat::~Mat(local_2a0);
  return this;
}

Assistant:

Mat
ssd(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat depth(height, width, 0);
    vector< vector<int> > min_ssd; // store min SSD values

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    for (int i = 0; i < height; ++i)
    {
        vector<int> tmp(width, numeric_limits<int>::max());
        min_ssd.push_back(tmp);
    }

    for (int offset = 0; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's SSD value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                int sum_sd = 0;

                if (type == "left")
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(left.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }
                else
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(right.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }

                // smaller SSD value found
                if (sum_sd < min_ssd[y][x])
                {
                    min_ssd[y][x] = sum_sd;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}